

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bassignmidstr(bstring a,const_bstring b,int left,int len)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uint uVar4;
  uint olen;
  uint uVar5;
  
  iVar2 = -1;
  if (((b != (const_bstring)0x0) && (b->data != (uchar *)0x0)) && (-1 < b->slen)) {
    uVar5 = 0;
    if (0 < left) {
      uVar5 = left;
    }
    iVar1 = 0;
    if (left < 0) {
      iVar1 = left;
    }
    olen = b->slen - uVar5;
    if (iVar1 + len < (int)olen) {
      olen = iVar1 + len;
    }
    if (((a != (bstring)0x0) && (puVar3 = a->data, puVar3 != (uchar *)0x0)) &&
       ((a->mlen != 0 && ((a->slen <= a->mlen && (-1 < a->slen)))))) {
      uVar4 = 0;
      if (0 < (int)olen) {
        iVar2 = balloc(a,olen);
        if (iVar2 != 0) {
          return -1;
        }
        memmove(a->data,b->data + uVar5,(ulong)olen);
        puVar3 = a->data;
        uVar4 = olen;
      }
      a->slen = uVar4;
      puVar3[uVar4] = '\0';
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int bassignmidstr (bstring a, const_bstring b, int left, int len) {
	if (b == NULL || b->data == NULL || b->slen < 0)
		return BSTR_ERR;

	if (left < 0) {
		len += left;
		left = 0;
	}

	if (len > b->slen - left) len = b->slen - left;

	if (a == NULL || a->data == NULL || a->mlen < a->slen ||
	    a->slen < 0 || a->mlen == 0)
		return BSTR_ERR;

	if (len > 0) {
		if (balloc (a, len) != BSTR_OK) return BSTR_ERR;
		bstr__memmove (a->data, b->data + left, len);
		a->slen = len;
	} else {
		a->slen = 0;
	}
	a->data[a->slen] = (unsigned char) '\0';
	return BSTR_OK;
}